

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas_axpym_impl.hpp
# Opt level: O1

void HAXX::HBLAS_AXPYM<double,HAXX::quaternion<double>,HAXX::quaternion<double>>
               (char SIDE,char TRANSA,int32_t M,int32_t N,quaternion<double> ALPHA,
               quaternion<double> *A,int32_t LDA,int32_t INCA,quaternion<double> *B,int32_t LDB,
               int32_t INCB)

{
  if (0 < M && 0 < N) {
    if ((((ALPHA._M_real != 0.0) || (NAN(ALPHA._M_real))) || (ALPHA._M_imag_i != 0.0)) ||
       (((NAN(ALPHA._M_imag_i) || (ALPHA._M_imag_j != 0.0)) || (NAN(ALPHA._M_imag_j))))) {
      if (TRANSA != 'N') {
        __assert_fail("TRANSA == \'N\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/include/hblas/generic/hblas1/hblas_axpym_impl.hpp"
                      ,0x1e,
                      "void HAXX::HBLAS_AXPYM(const char, const char, const int32_t, const int32_t, const _AlphaF, _XF *const, const int32_t, const int32_t, quaternion<_F> *const, const int32_t, const int32_t) [_F = double, _XF = HAXX::quaternion<double>, _AlphaF = HAXX::quaternion<double>]"
                     );
      }
      if (0 < N) {
        do {
          HBLAS_AXPYV<double,HAXX::quaternion<double>,HAXX::quaternion<double>>
                    (SIDE,M,ALPHA,A,INCA,B,INCB);
          B = B + LDB;
          A = A + LDA;
          N = N + -1;
        } while (N != 0);
      }
    }
  }
  return;
}

Assistant:

void HBLAS_AXPYM(const char SIDE, const char TRANSA, const HAXX_INT M, 
  const HAXX_INT N, const _AlphaF ALPHA, _XF * const A, const HAXX_INT LDA, 
  const HAXX_INT INCA, quaternion<_F> * const B, const HAXX_INT LDB, 
  const HAXX_INT INCB) {

  
  if( N <= 0 or M <= 0) return;
  if( ALPHA == _AlphaF(0.) ) return;

  assert(TRANSA == 'N'); // Only supporting scaling for now

  HAXX_INT j;
  
  quaternion<_F> *locA = A, *locB = B;

  for( j = 0; j < N; j++ ) {
    HBLAS_AXPYV(SIDE,M,ALPHA,locA,INCA,locB,INCB);
    locA += LDA;
    locB += LDB;
  }

}